

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

kvtree * kvtree_setf(kvtree *hash,kvtree *hash_value,char *format,...)

{
  char *hash_00;
  char in_AL;
  int iVar1;
  kvtree *hash_value_00;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_6b8;
  undefined8 *local_690;
  undefined8 *local_660;
  undefined8 *local_638;
  uint *local_610;
  undefined8 *local_5e8;
  undefined8 *local_5c0;
  uint *local_598;
  undefined8 *local_570;
  uint local_548 [6];
  undefined8 local_530;
  undefined8 local_528;
  undefined8 local_520;
  undefined8 local_518;
  undefined8 local_508;
  undefined8 local_4f8;
  undefined8 local_4e8;
  undefined8 local_4d8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  kvtree *local_498;
  kvtree *tmp;
  char local_488 [4];
  int size;
  char key [1024];
  int local_7c;
  uint local_78;
  int i;
  va_list args;
  int local_54;
  char *pcStack_50;
  int count;
  char *token;
  char *search;
  char *format_copy;
  char *rest;
  kvtree *h;
  char *format_local;
  kvtree *hash_value_local;
  kvtree *hash_local;
  
  if (in_AL != '\0') {
    local_518 = in_XMM0_Qa;
    local_508 = in_XMM1_Qa;
    local_4f8 = in_XMM2_Qa;
    local_4e8 = in_XMM3_Qa;
    local_4d8 = in_XMM4_Qa;
    local_4c8 = in_XMM5_Qa;
    local_4b8 = in_XMM6_Qa;
    local_4a8 = in_XMM7_Qa;
  }
  if (hash == (kvtree *)0x0) {
    hash_local = (kvtree *)0x0;
  }
  else {
    format_copy = (char *)0x0;
    local_530 = in_RCX;
    local_528 = in_R8;
    local_520 = in_R9;
    rest = (char *)hash;
    h = (kvtree *)format;
    format_local = (char *)hash_value;
    hash_value_local = hash;
    search = strdup(format);
    if (search == (char *)0x0) {
      kvtree_abort(-1,"Failed to duplicate format string @ %s:%d",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                   ,0x138);
    }
    pcStack_50 = strtok_r(search," ",&format_copy);
    local_54 = 0;
    while (pcStack_50 != (char *)0x0) {
      pcStack_50 = strtok_r((char *)0x0," ",&format_copy);
      local_54 = local_54 + 1;
    }
    kvtree_free(&search);
    search = strdup((char *)h);
    if (search == (char *)0x0) {
      kvtree_abort(-1,"Failed to duplicate format string @ %s:%d",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                   ,0x150);
    }
    args[0]._0_8_ = &stack0x00000008;
    i = 0x30;
    local_78 = 0x18;
    pcStack_50 = strtok_r(search," ",&format_copy);
    local_7c = 0;
    while( true ) {
      bVar2 = false;
      if ((local_7c < local_54) && (bVar2 = false, pcStack_50 != (char *)0x0)) {
        bVar2 = rest != (char *)0x0;
      }
      if (!bVar2) break;
      tmp._4_4_ = 0;
      iVar1 = strcmp(pcStack_50,"%s");
      if (iVar1 == 0) {
        if (local_78 < 0x29) {
          local_570 = (undefined8 *)((long)local_548 + (long)(int)local_78);
          local_78 = local_78 + 8;
        }
        else {
          local_570 = (undefined8 *)args[0]._0_8_;
          args[0]._0_8_ = args[0]._0_8_ + 8;
        }
        tmp._4_4_ = snprintf(local_488,0x400,pcStack_50,*local_570);
      }
      else {
        iVar1 = strcmp(pcStack_50,"%d");
        if (iVar1 == 0) {
          if (local_78 < 0x29) {
            local_598 = (uint *)((long)local_548 + (long)(int)local_78);
            local_78 = local_78 + 8;
          }
          else {
            local_598 = (uint *)args[0]._0_8_;
            args[0]._0_8_ = args[0]._0_8_ + 8;
          }
          tmp._4_4_ = snprintf(local_488,0x400,pcStack_50,(ulong)*local_598);
        }
        else {
          iVar1 = strcmp(pcStack_50,"%lld");
          if (iVar1 == 0) {
            if (local_78 < 0x29) {
              local_5c0 = (undefined8 *)((long)local_548 + (long)(int)local_78);
              local_78 = local_78 + 8;
            }
            else {
              local_5c0 = (undefined8 *)args[0]._0_8_;
              args[0]._0_8_ = args[0]._0_8_ + 8;
            }
            tmp._4_4_ = snprintf(local_488,0x400,pcStack_50,*local_5c0);
          }
          else {
            iVar1 = strcmp(pcStack_50,"%lu");
            if (iVar1 == 0) {
              if (local_78 < 0x29) {
                local_5e8 = (undefined8 *)((long)local_548 + (long)(int)local_78);
                local_78 = local_78 + 8;
              }
              else {
                local_5e8 = (undefined8 *)args[0]._0_8_;
                args[0]._0_8_ = args[0]._0_8_ + 8;
              }
              tmp._4_4_ = snprintf(local_488,0x400,pcStack_50,*local_5e8);
            }
            else {
              iVar1 = strcmp(pcStack_50,"%#x");
              if (iVar1 == 0) {
                if (local_78 < 0x29) {
                  local_610 = (uint *)((long)local_548 + (long)(int)local_78);
                  local_78 = local_78 + 8;
                }
                else {
                  local_610 = (uint *)args[0]._0_8_;
                  args[0]._0_8_ = args[0]._0_8_ + 8;
                }
                tmp._4_4_ = snprintf(local_488,0x400,pcStack_50,(ulong)*local_610);
              }
              else {
                iVar1 = strcmp(pcStack_50,"%#lx");
                if (iVar1 == 0) {
                  if (local_78 < 0x29) {
                    local_638 = (undefined8 *)((long)local_548 + (long)(int)local_78);
                    local_78 = local_78 + 8;
                  }
                  else {
                    local_638 = (undefined8 *)args[0]._0_8_;
                    args[0]._0_8_ = args[0]._0_8_ + 8;
                  }
                  tmp._4_4_ = snprintf(local_488,0x400,pcStack_50,*local_638);
                }
                else {
                  iVar1 = strcmp(pcStack_50,"%llu");
                  if (iVar1 == 0) {
                    if (local_78 < 0x29) {
                      local_660 = (undefined8 *)((long)local_548 + (long)(int)local_78);
                      local_78 = local_78 + 8;
                    }
                    else {
                      local_660 = (undefined8 *)args[0]._0_8_;
                      args[0]._0_8_ = args[0]._0_8_ + 8;
                    }
                    tmp._4_4_ = snprintf(local_488,0x400,pcStack_50,*local_660);
                  }
                  else {
                    iVar1 = strcmp(pcStack_50,"%f");
                    if (iVar1 == 0) {
                      if ((uint)i < 0xa1) {
                        local_690 = (undefined8 *)((long)local_548 + (long)i);
                        i = i + 0x10;
                      }
                      else {
                        local_690 = (undefined8 *)args[0]._0_8_;
                        args[0]._0_8_ = args[0]._0_8_ + 8;
                      }
                      tmp._4_4_ = snprintf(local_488,0x400,pcStack_50,*local_690);
                    }
                    else {
                      iVar1 = strcmp(pcStack_50,"%p");
                      if (iVar1 == 0) {
                        if (local_78 < 0x29) {
                          local_6b8 = (undefined8 *)((long)local_548 + (long)(int)local_78);
                          local_78 = local_78 + 8;
                        }
                        else {
                          local_6b8 = (undefined8 *)args[0]._0_8_;
                          args[0]._0_8_ = args[0]._0_8_ + 8;
                        }
                        tmp._4_4_ = snprintf(local_488,0x400,pcStack_50,*local_6b8);
                      }
                      else {
                        kvtree_abort(-1,"Unsupported hash key format \'%s\' @ %s:%d",pcStack_50,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                                     ,0x173);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (0x3ff < tmp._4_4_) {
        kvtree_abort(-1,"Key buffer too small, have %lu need %d bytes @ %s:%d",0x400,
                     (ulong)tmp._4_4_,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                     ,0x17a);
      }
      if (local_7c < local_54 + -1) {
        local_498 = kvtree_get((kvtree *)rest,local_488);
        hash_00 = rest;
        if (local_498 == (kvtree *)0x0) {
          hash_value_00 = kvtree_new();
          local_498 = kvtree_set((kvtree *)hash_00,local_488,hash_value_00);
        }
        rest = (char *)local_498;
      }
      else {
        rest = (char *)kvtree_set((kvtree *)rest,local_488,(kvtree *)format_local);
      }
      pcStack_50 = strtok_r((char *)0x0," ",&format_copy);
      local_7c = local_7c + 1;
    }
    kvtree_free(&search);
    hash_local = (kvtree *)rest;
  }
  return hash_local;
}

Assistant:

kvtree* kvtree_setf(kvtree* hash, kvtree* hash_value, const char* format, ...)
{
  /* check that we have a hash */
  if (hash == NULL) {
    return NULL;
  }

  kvtree* h = hash;
  char *rest = NULL;

  /* make a copy of the format specifier, since strtok will clobber
   * it */
  char* format_copy = strdup(format);
  if (format_copy == NULL) {
    kvtree_abort(-1, "Failed to duplicate format string @ %s:%d",
      __FILE__, __LINE__
    );
  }

  /* we break up tokens by spaces */
  char* search = " ";
  char* token = NULL;

  /* count how many keys we have */
  token = strtok_r(format_copy, search, &rest);
  int count = 0;
  while (token != NULL) {
    token = strtok_r(NULL, search, &rest);
    count++;
  }

  /* free our copy of the format specifier */
  kvtree_free(&format_copy);

  /* make a copy of the format specifier, since strtok will clobber
   * it */
  format_copy = strdup(format);
  if (format_copy == NULL) {
    kvtree_abort(-1, "Failed to duplicate format string @ %s:%d",
      __FILE__, __LINE__
    );
  }

  /* for each format specifier, convert the next key argument to a
   * string and look up the hash for that key */
  va_list args;
  va_start(args, format);
  token = strtok_r(format_copy, search, &rest);
  int i = 0;
  while (i < count && token != NULL && h != NULL) {
    /* interpret the format and convert the current key argument to
     * a string */
    char key[KVTREE_MAX_LINE];
    int size = 0;
    if (strcmp(token, "%s") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, char*));
    } else if (strcmp(token, "%d")  == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, int));
    } else if (strcmp(token, "%lld") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, long long));
    } else if (strcmp(token, "%lu") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned long));
    } else if (strcmp(token, "%#x") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned int));
    } else if (strcmp(token, "%#lx") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned long));
    } else if (strcmp(token, "%llu") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned long long));
    } else if (strcmp(token, "%f") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, double));
    } else if (strcmp(token, "%p") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, void*));
    } else {
      kvtree_abort(-1, "Unsupported hash key format '%s' @ %s:%d",
        token, __FILE__, __LINE__
      );
    }

    /* check that we were able to fit the string into our buffer */
    if (size >= sizeof(key)) {
      kvtree_abort(-1, "Key buffer too small, have %lu need %d bytes @ %s:%d",
        sizeof(key), size, __FILE__, __LINE__
      );
    }

    if (i < count-1) {
      /* check whether we have an entry for this key in the current
       * hash */
      kvtree* tmp = kvtree_get(h, key);

      /* didn't find an entry for this key, so create one */
      if (tmp == NULL) {
        tmp = kvtree_set(h, key, kvtree_new());
      }

      /* now we have a hash for this key, continue with the next key */
      h = tmp;
    } else {
      /* we are at the last key, so set its hash using the value
       * provided by the caller */
      h = kvtree_set(h, key, hash_value);
    }

    /* get the next format string */
    token = strtok_r(NULL, search, &rest);
    i++;
  }
  va_end(args);

  /* free our copy of the format specifier */
  kvtree_free(&format_copy);

  /* return the hash we found */
  return h;
}